

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O2

void __thiscall Assimp::BatchData::~BatchData(BatchData *this)

{
  Importer *this_00;
  
  Importer::SetIOHandler(this->pImporter,(IOSystem *)0x0);
  this_00 = this->pImporter;
  if (this_00 != (Importer *)0x0) {
    Importer::~Importer(this_00);
  }
  operator_delete(this_00,8);
  std::__cxx11::string::~string((string *)&this->pathBase);
  std::__cxx11::_List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>::_M_clear
            (&(this->requests).
              super__List_base<Assimp::LoadRequest,_std::allocator<Assimp::LoadRequest>_>);
  return;
}

Assistant:

~BatchData() {
        pImporter->SetIOHandler( nullptr ); /* get pointer back into our possession */
        delete pImporter;
    }